

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test7::configureXFBBuffer(GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  int iVar3;
  _variable *variable;
  pointer p_Var4;
  
  p_Var4 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar3 = 0;
  if (p_Var4 != (variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar1 = Utils::getNumberOfComponentsForVariableType(p_Var4->type);
      iVar3 = iVar3 + uVar1 * p_Var4->array_size * 8;
      p_Var4 = p_Var4 + 1;
    } while (p_Var4 != (variables->
                       super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    iVar3 = iVar3 * 6;
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x150))(0x8c8e,iVar3,0,0x88e4);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2362);
  return;
}

Assistant:

void GPUShaderFP64Test7::configureXFBBuffer(const _variables& variables)
{
	DE_ASSERT(m_n_xfb_varyings != 0);

	/* Geometry shaders outputs 4 vertices making up a triangle strip per draw call.
	 * The test only draws a single patch, and triangles are caught by transform feed-back.
	 * Let's initialize the storage, according to the list of variables that will be used
	 * for the test run.
	 */
	unsigned int bo_size = 0;

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 variables_iterator++)
	{
		const _variable& variable		= *variables_iterator;
		unsigned int	 n_bytes_needed = static_cast<unsigned int>(
			Utils::getNumberOfComponentsForVariableType(variable.type) * variable.array_size * sizeof(double));

		bo_size += n_bytes_needed;
	} /* for (all variables) */

	bo_size *= 3 /* vertices per triangle */ * 2; /* triangles emitted by geometry shader */

	/* Set up the BO storage */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL /* data */, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");
}